

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialDistortion::cleanProperties(RadialDistortion *this,Properties *prop,int id)

{
  Properties *this_00;
  char *pcVar1;
  Properties *in_RSI;
  int in_stack_00000044;
  char *in_stack_00000048;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [40];
  Properties *local_10;
  
  local_10 = in_RSI;
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000048,in_stack_00000044);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_59);
  gutil::Properties::remove(in_RSI,(char *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::~string(local_58);
  this_00 = local_10;
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000048,in_stack_00000044);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar1,&local_b1);
  gutil::Properties::remove(this_00,(char *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_b0);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000048,in_stack_00000044);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar1,&local_f9);
  gutil::Properties::remove(local_10,(char *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_f8);
  return;
}

Assistant:

void RadialDistortion::cleanProperties(gutil::Properties &prop, int id) const
{
  prop.remove(getCameraKey("k1", id).c_str());
  prop.remove(getCameraKey("k2", id).c_str());
  prop.remove(getCameraKey("k3", id).c_str());
}